

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O3

Am_Object get_undo_handler_from_cmd(Am_Object *cmd)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object *in_RSI;
  Am_Object widget;
  Am_Object window;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  
  local_30.data = (Am_Object_Data *)0x0;
  local_28.data = (Am_Object_Data *)0x0;
  cmd->data = (Am_Object_Data *)0x0;
  Am_Object::Am_Object(&local_20,in_RSI);
  Am_Get_Selection_Widget_For_Command(&local_18);
  Am_Object::operator=(&local_30,&local_18);
  Am_Object::~Am_Object(&local_18);
  Am_Object::~Am_Object(&local_20);
  bVar1 = Am_Object::Valid(&local_30);
  if (bVar1) {
    pAVar2 = Am_Object::Get(&local_30,0x68,0);
    Am_Object::operator=(&local_28,pAVar2);
  }
  bVar1 = Am_Object::Valid(&local_28);
  if (!bVar1) {
    pAVar2 = Am_Object::Get(in_RSI,0x170,0);
    Am_Object::operator=(&local_30,pAVar2);
    bVar1 = Am_Object::Valid(&local_30);
    if (bVar1) {
      pAVar2 = Am_Object::Get(&local_30,0x68,0);
      Am_Object::operator=(&local_28,pAVar2);
    }
  }
  bVar1 = Am_Object::Valid(&local_28);
  if (bVar1) {
    pAVar2 = Am_Object::Get(&local_28,0x174,0);
    Am_Object::operator=(cmd,pAVar2);
  }
  Am_Object::~Am_Object(&local_28);
  Am_Object::~Am_Object(&local_30);
  return (Am_Object)(Am_Object_Data *)cmd;
}

Assistant:

Am_Object
get_undo_handler_from_cmd(Am_Object cmd)
{
  Am_Object widget, window, undo_handler;
  widget = Am_Get_Selection_Widget_For_Command(cmd);
  if (widget.Valid())
    window = widget.Get(Am_WINDOW);
  if (!window.Valid()) {
    widget = cmd.Get(Am_SAVED_OLD_OWNER);
    if (widget.Valid())
      window = widget.Get(Am_WINDOW);
  }
  if (window.Valid())
    undo_handler = window.Get(Am_UNDO_HANDLER);
  return undo_handler;
}